

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cpp
# Opt level: O0

int cinemo::args::processArgs
              (int argc,char **argv,Options *options,
              vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  ostream *poVar4;
  allocator local_131;
  string local_130 [39];
  allocator local_109;
  string local_108 [39];
  allocator local_e1;
  string local_e0 [32];
  undefined4 local_c0;
  allocator local_b9;
  string local_b8 [48];
  string local_88 [8];
  string arg2;
  string local_68 [8];
  string arg1;
  string local_48 [8];
  string workDir;
  vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw_local;
  Options *options_local;
  char **argv_local;
  int argc_local;
  
  std::__cxx11::string::string(local_48);
  std::__cxx11::string::string(local_68);
  std::__cxx11::string::string(local_88);
  std::__cxx11::string::operator=(local_48,*argv);
  if (argc == 1) {
    getWorkingDirectoryFromExec((string *)local_48);
  }
  else if ((argc == 2) || (argc == 3)) {
    pcVar1 = argv[1];
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_b8,pcVar1,&local_b9);
    std::__cxx11::string::operator=(local_68,local_b8);
    std::__cxx11::string::~string(local_b8);
    std::allocator<char>::~allocator((allocator<char> *)&local_b9);
    lVar3 = std::__cxx11::string::find((char *)local_68,0x10e034);
    if (lVar3 == 0) {
      lVar3 = std::__cxx11::string::find((char *)local_68,0x10e07c);
      if (lVar3 == 1) {
        printUsage();
        argv_local._4_4_ = 0;
        goto LAB_00105038;
      }
      lVar3 = std::__cxx11::string::find((char *)local_68,0x10e37c);
      if (lVar3 == 1) {
        wh::printFlags();
        argv_local._4_4_ = 0;
        goto LAB_00105038;
      }
      lVar3 = std::__cxx11::string::find((char *)local_68,0x10e44e);
      if (lVar3 == 1) {
        options->verbose = true;
        if (argc < 3) {
          getWorkingDirectoryFromExec((string *)local_48);
        }
        else if (argc == 3) {
          pcVar1 = argv[2];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_e0,pcVar1,&local_e1);
          std::__cxx11::string::operator=(local_48,local_e0);
          std::__cxx11::string::~string(local_e0);
          std::allocator<char>::~allocator((allocator<char> *)&local_e1);
        }
      }
      else {
        lVar3 = std::__cxx11::string::find((char *)local_68,0x10e70d);
        if (lVar3 != 1) {
          poVar4 = std::operator<<((ostream *)&std::cout,"Invalid option \'");
          poVar4 = std::operator<<(poVar4,local_68);
          poVar4 = std::operator<<(poVar4,"\'. Use -h for usage.");
          std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
          argv_local._4_4_ = 1;
          goto LAB_00105038;
        }
        options->noThread = true;
        if (argc < 3) {
          getWorkingDirectoryFromExec((string *)local_48);
        }
        else if (argc == 3) {
          pcVar1 = argv[2];
          std::allocator<char>::allocator();
          std::__cxx11::string::string(local_108,pcVar1,&local_109);
          std::__cxx11::string::operator=(local_48,local_108);
          std::__cxx11::string::~string(local_108);
          std::allocator<char>::~allocator((allocator<char> *)&local_109);
        }
      }
    }
    else {
      pcVar1 = argv[1];
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_130,pcVar1,&local_131);
      std::__cxx11::string::operator=(local_48,local_130);
      std::__cxx11::string::~string(local_130);
      std::allocator<char>::~allocator((allocator<char> *)&local_131);
      getWorkingDirectoryFromExec((string *)local_48);
    }
  }
  bVar2 = isValidWorkDirectory((string *)local_48);
  if (bVar2) {
    poVar4 = std::operator<<((ostream *)&std::cout,"Looking for wave files in ");
    poVar4 = std::operator<<(poVar4,local_48);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    bVar2 = getWaveFiles((string *)local_48,lw);
    if (!bVar2) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Can not find any WAV file(s) in ");
      poVar4 = std::operator<<(poVar4,local_48);
      std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    }
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,local_48);
    poVar4 = std::operator<<(poVar4," Is not a directory.");
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  }
  argv_local._4_4_ = 0;
LAB_00105038:
  local_c0 = 1;
  std::__cxx11::string::~string(local_88);
  std::__cxx11::string::~string(local_68);
  std::__cxx11::string::~string(local_48);
  return argv_local._4_4_;
}

Assistant:

int args::processArgs(int argc, char* argv[], args::Options& options,
                          vector<LameWrapper*>& lw) {

        string workDir;
        string arg1;
        string arg2;

        //FIXME I know I might be blamed for this mess, but later I'll use getopt header
        workDir = argv[0];

        if (argc == 1) {

#ifdef WIN32
            //If no arguments given, this code finds the current exe directory
            //FIXME this assumes system is not UNICODE
            HMODULE hModule = GetModuleHandleW(nullptr);
            WCHAR buffer[MAX_PATH];
            GetModuleFileNameW(hModule, buffer, MAX_PATH);
            char path[MAX_PATH * 2];
            std::wcstombs(path, buffer, MAX_PATH * 2);
            string exePath(path);
            int rIndex = exePath.find_last_of(PATH_SEPARATOR);
            if(rIndex == 0 || rIndex == string::npos) {
                cout << "Can not determine the current executable directory,"
                    << " please pass the directory as an argument."
                    << " Use -h for more information.";
                return 1;
            }
            workDir = exePath.substr(0, rIndex);
#endif
            getWorkingDirectoryFromExec(workDir);
        } else if (argc == 2 || argc == 3) {
            arg1 = string(argv[1]);
            if (arg1.find("-") == 0) {
                if (arg1.find("h") == 1) {
                    args::printUsage();
                    return 0;
                } else if (arg1.find("e") == 1) {
                    wh::printFlags();
                    return 0;
                } else if (arg1.find("v") == 1) {
                    options.verbose = true;
                    if (argc < 3) {
                        getWorkingDirectoryFromExec(workDir);
                    } else if (argc == 3) {
                        workDir = string(argv[2]);
                    }
                } else if (arg1.find("n") == 1) {
                    options.noThread = true;
                    if (argc < 3) {
                        getWorkingDirectoryFromExec(workDir);
                    } else if (argc == 3) {
                        workDir = string(argv[2]);
                    }
                } else {
                    cout << "Invalid option '" << arg1
                         << "'. Use -h for usage." << endl;
                    return 1;
                }
            } else {
                workDir = string(argv[1]);
                getWorkingDirectoryFromExec(workDir);
            }
        }

        if (isValidWorkDirectory(workDir)) {
            cout << "Looking for wave files in " << workDir << endl;
            if (!getWaveFiles(workDir, lw)) {
                cout << "Can not find any WAV file(s) in " << workDir << endl;
            }
        } else {
            cout << workDir << " Is not a directory." << endl;
        }

        return 0;
    }